

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::VerifyByteCodeUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,
          BVSparse<Memory::JitArenaAllocator> *trackingByteCodeUpwardExposedUsed,Instr *instr,
          uint32 bytecodeOffset)

{
  Type TVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BVSparse<Memory::JitArenaAllocator> *bv;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BackwardPass *this_01;
  BVSparse<Memory::JitArenaAllocator> *pBVar6;
  BVUnitT<unsigned_long> local_48;
  SparseBVUnit _unit;
  
  _unit.word = (Type)block;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22cf,"(instr)","instr");
    if (!bVar4) goto LAB_003ca316;
    *puVar5 = 0;
  }
  if (bytecodeOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22d0,"(bytecodeOffset != Js::Constants::NoByteCodeOffset)",
                       "bytecodeOffset != Js::Constants::NoByteCodeOffset");
    if (!bVar4) goto LAB_003ca316;
    *puVar5 = 0;
  }
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22d1,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase"
                      );
    if (!bVar4) goto LAB_003ca316;
    *puVar5 = 0;
  }
  if (trackingByteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_01 = (BackwardPass *)trackingByteCodeUpwardExposedUsed;
    bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(trackingByteCodeUpwardExposedUsed);
    if ((!bVar4) && ((this->func->field_0x240 & 0x10) != 0)) {
      bv = GetByteCodeRegisterUpwardExposed(this_01,(BasicBlock *)_unit.word,func,this->tempAlloc);
      this_00 = BVSparse<Memory::JitArenaAllocator>::MinusNew
                          (trackingByteCodeUpwardExposedUsed,bv,this->tempAlloc);
      bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this_00);
      if (!bVar4) {
        _unit.word = (Type)this;
        Output::Print(L"\n\nByteCode Updward Exposed mismatch after DeadStore\n");
        Output::Print(L"Mismatch Instr:\n");
        IR::Instr::Dump(instr);
        Output::Print(
                     L"  ByteCode Register list present before Backward pass missing in DeadStore pass:\n"
                     );
        pBVar6 = this_00;
        while (pBVar6 = (BVSparse<Memory::JitArenaAllocator> *)pBVar6->head,
              pBVar6 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          TVar1 = *(Type *)&pBVar6->lastFoundIndex;
          local_48.word = ((Type *)&pBVar6->alloc)->word;
          while (local_48.word != 0) {
            lVar2 = 0;
            if (local_48.word != 0) {
              for (; (local_48.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            BVUnitT<unsigned_long>::Clear(&local_48,(BVIndex)lVar2);
            Output::Print(L"    R%u\n",(ulong)(TVar1 + (BVIndex)lVar2));
          }
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x22e8,"(false)","ByteCode Updward Exposed Used Mismatch");
        if (!bVar4) {
LAB_003ca316:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
        this = (BackwardPass *)_unit;
      }
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->tempAlloc,this_00);
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->tempAlloc,bv);
    }
  }
  return;
}

Assistant:

void
BackwardPass::VerifyByteCodeUpwardExposed(BasicBlock* block, Func* func, BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed, IR::Instr* instr, uint32 bytecodeOffset)
{
    Assert(instr);
    Assert(bytecodeOffset != Js::Constants::NoByteCodeOffset);
    Assert(this->tag == Js::DeadStorePhase);

    // The calculated bytecode upward exposed should be the same between Backward and DeadStore passes
    if (trackingByteCodeUpwardExposedUsed && !trackingByteCodeUpwardExposedUsed->IsEmpty())
    {
        // We don't need to track bytecodeUpwardExposeUses if we don't have bailout
        // We've collected the Backward bytecodeUpwardExposeUses for nothing, oh well.
        if (this->func->hasBailout)
        {
            BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = GetByteCodeRegisterUpwardExposed(block, func, this->tempAlloc);
            BVSparse<JitArenaAllocator>* notInDeadStore = trackingByteCodeUpwardExposedUsed->MinusNew(byteCodeUpwardExposedUsed, this->tempAlloc);

            if (!notInDeadStore->IsEmpty())
            {
                Output::Print(_u("\n\nByteCode Updward Exposed mismatch after DeadStore\n"));
                Output::Print(_u("Mismatch Instr:\n"));
                instr->Dump();
                Output::Print(_u("  ByteCode Register list present before Backward pass missing in DeadStore pass:\n"));
                FOREACH_BITSET_IN_SPARSEBV(bytecodeReg, notInDeadStore)
                {
                    Output::Print(_u("    R%u\n"), bytecodeReg);
                }
                NEXT_BITSET_IN_SPARSEBV;
                AssertMsg(false, "ByteCode Updward Exposed Used Mismatch");
            }
            JitAdelete(this->tempAlloc, notInDeadStore);
            JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
        }
    }
}